

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O2

void __thiscall PluginFverb::initParameter(PluginFverb *this,uint32_t index,Parameter *parameter)

{
  float fVar1;
  bool bVar2;
  char *pcVar3;
  ParameterRange *pPVar4;
  uint index_00;
  int iStack_20;
  
  if (0xe < index) {
    pcVar3 = "index < kNumParameters";
    iStack_20 = 0x3b;
LAB_0010779f:
    d_safe_assert(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                  ,iStack_20);
    return;
  }
  if (index == 0xe) {
    parameter->hints = 1;
    DISTRHO::String::operator=(&parameter->name,"Vintage");
    DISTRHO::String::operator=(&parameter->symbol,"vintage");
    *(byte *)&parameter->hints = (byte)parameter->hints | 6;
    (parameter->ranges).def = 0.0;
    (parameter->ranges).min = 0.0;
    (parameter->ranges).max = 1.0;
    return;
  }
  if (index == 0xc) {
    parameter->hints = 1;
    DISTRHO::String::operator=(&parameter->name,"Dry");
    pcVar3 = "dry";
  }
  else {
    if (index != 0xd) {
      if (index == 0) {
        DISTRHO::Parameter::initDesignation(parameter,kParameterDesignationBypass);
        return;
      }
      index_00 = index - 1;
      if (index_00 < 0xb) {
        parameter->hints = 1;
        pcVar3 = Fverb::parameter_label(index_00);
        DISTRHO::String::operator=(&parameter->name,pcVar3);
        pcVar3 = Fverb::parameter_short_label(index_00);
        DISTRHO::String::operator=(&parameter->shortName,pcVar3);
        pcVar3 = Fverb::parameter_symbol(index_00);
        DISTRHO::String::operator=(&parameter->symbol,pcVar3);
        pcVar3 = Fverb::parameter_unit(index_00);
        DISTRHO::String::operator=(&parameter->unit,pcVar3);
        pPVar4 = Fverb::parameter_range(index_00);
        fVar1 = pPVar4->min;
        (parameter->ranges).def = pPVar4->init;
        (parameter->ranges).min = fVar1;
        (parameter->ranges).max = pPVar4->max;
        bVar2 = Fverb::parameter_is_trigger(index_00);
        if (bVar2) {
          *(byte *)&parameter->hints = (byte)parameter->hints | 0x22;
        }
        bVar2 = Fverb::parameter_is_boolean(index_00);
        if (bVar2) {
          *(byte *)&parameter->hints = (byte)parameter->hints | 6;
        }
        bVar2 = Fverb::parameter_is_integer(index_00);
        if (bVar2) {
          *(byte *)&parameter->hints = (byte)parameter->hints | 4;
        }
        bVar2 = Fverb::parameter_is_logarithmic(index_00);
        if (!bVar2) {
          return;
        }
        *(byte *)&parameter->hints = (byte)parameter->hints | 8;
        return;
      }
      pcVar3 = "index >= pIdDspFirst && index <= pIdDspLast";
      iStack_20 = 0x5e;
      goto LAB_0010779f;
    }
    parameter->hints = 1;
    DISTRHO::String::operator=(&parameter->name,"Wet");
    pcVar3 = "wet";
  }
  DISTRHO::String::operator=(&parameter->symbol,pcVar3);
  (parameter->ranges).def = 0.0;
  (parameter->ranges).min = 0.0;
  (parameter->ranges).max = 100.0;
  DISTRHO::String::operator=(&parameter->unit,"%");
  return;
}

Assistant:

void PluginFverb::initParameter(uint32_t index, Parameter &parameter)
{
    DISTRHO_SAFE_ASSERT_RETURN(index < kNumParameters, );

    switch (index) {
    case pIdBypass:
        parameter.initDesignation(kParameterDesignationBypass);
        return;
    case pIdDry:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Dry";
        parameter.symbol = "dry";
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 100;
        parameter.unit = "%";
        return;
    case pIdWet:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Wet";
        parameter.symbol = "wet";
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 100;
        parameter.unit = "%";
        return;
    case pIdVintage:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Vintage";
        parameter.symbol = "vintage";
        parameter.hints |= kParameterIsBoolean|kParameterIsInteger;
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 1;
        return;
    }

    DISTRHO_SAFE_ASSERT_RETURN(index >= pIdDspFirst && index <= pIdDspLast, );
    index -= pIdDspFirst;

    parameter.hints = kParameterIsAutomatable;

    parameter.name = Fverb::parameter_label(index);
    parameter.shortName = Fverb::parameter_short_label(index);
    parameter.symbol = Fverb::parameter_symbol(index);
    parameter.unit = Fverb::parameter_unit(index);

    const Fverb::ParameterRange &range = *Fverb::parameter_range(index);
    parameter.ranges.def = range.init;
    parameter.ranges.min = range.min;
    parameter.ranges.max = range.max;

    if (Fverb::parameter_is_trigger(index))
        parameter.hints |= kParameterIsTrigger;
    if (Fverb::parameter_is_boolean(index))
        parameter.hints |= kParameterIsBoolean|kParameterIsInteger;
    if (Fverb::parameter_is_integer(index))
        parameter.hints |= kParameterIsInteger;
    if (Fverb::parameter_is_logarithmic(index))
        parameter.hints |= kParameterIsLogarithmic;
}